

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_drawinfo.cpp
# Opt level: O0

void __thiscall
FDrawInfo::DrawFloodedPlane(FDrawInfo *this,wallseg *ws,float planez,sector_t *sec,bool ceiling)

{
  bool bVar1;
  int rellight;
  FMaterial *mat;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float x;
  float z;
  float x_00;
  float z_00;
  float x_01;
  int local_ec;
  undefined1 local_e8 [8];
  FQuadDrawer qd;
  float py4;
  float px4;
  float py3;
  float px3;
  float py2;
  float px2;
  float py1;
  float px1;
  float prj_fac2;
  float prj_fac1;
  float fviewz;
  float fviewy;
  float fviewx;
  int rel;
  FMaterial *gltexture;
  FColormap Colormap;
  int lightlevel;
  GLSectorPlane plane;
  bool ceiling_local;
  sector_t *sec_local;
  float planez_local;
  wallseg *ws_local;
  FDrawInfo *this_local;
  
  GLSectorPlane::GLSectorPlane((GLSectorPlane *)&Colormap.blendfactor);
  FColormap::FColormap((FColormap *)((long)&gltexture + 4));
  GLSectorPlane::GetFromSector((GLSectorPlane *)&Colormap.blendfactor,sec,(uint)ceiling);
  mat = FMaterial::ValidateTexture((FTextureID)Colormap.blendfactor,false,true);
  if (mat != (FMaterial *)0x0) {
    if (gl_fixedcolormap == 0) {
      FColormap::operator=((FColormap *)((long)&gltexture + 4),sec->ColorMap);
      bVar1 = FTexture::isFullbright(mat->tex);
      if (bVar1) {
        gltexture._4_1_ = 0xff;
        gltexture._5_1_ = 0xff;
        gltexture._6_1_ = 0xff;
        Colormap.desaturation = 0xff;
      }
      else {
        if (ceiling) {
          local_ec = sector_t::GetCeilingLight(sec);
        }
        else {
          local_ec = sector_t::GetFloorLight(sec);
        }
        Colormap.desaturation = local_ec;
        if (local_ec < 1) {
          Colormap.desaturation = -local_ec;
        }
      }
    }
    else {
      FColormap::Clear((FColormap *)((long)&gltexture + 4));
      Colormap.desaturation = 0xff;
    }
    rellight = getExtraLight();
    gl_SetColor(Colormap.desaturation,rellight,(FColormap *)((long)&gltexture + 4),1.0,false);
    gl_SetFog(Colormap.desaturation,rellight,(FColormap *)((long)&gltexture + 4),false);
    FRenderState::SetMaterial(&gl_RenderState,mat,0,0,-1,false);
    fVar2 = (float)ViewPos.X;
    fVar3 = (float)ViewPos.Y;
    fVar4 = (float)ViewPos.Z;
    gl_SetPlaneTextureRotation((GLSectorPlane *)&Colormap.blendfactor,mat);
    FRenderState::Apply(&gl_RenderState);
    fVar5 = (planez - fVar4) / (ws->z1 - fVar4);
    fVar4 = (planez - fVar4) / (ws->z2 - fVar4);
    x = fVar2 + fVar5 * (ws->x1 - fVar2);
    z = fVar3 + fVar5 * (ws->y1 - fVar3);
    x_00 = fVar2 + fVar4 * (ws->x1 - fVar2);
    z_00 = fVar3 + fVar4 * (ws->y1 - fVar3);
    x_01 = fVar2 + fVar4 * (ws->x2 - fVar2);
    fVar4 = fVar3 + fVar4 * (ws->y2 - fVar3);
    fVar2 = fVar2 + fVar5 * (ws->x2 - fVar2);
    qd._12_4_ = fVar3 + fVar5 * (ws->y2 - fVar3);
    FQuadDrawer::FQuadDrawer((FQuadDrawer *)local_e8);
    FQuadDrawer::Set((FQuadDrawer *)local_e8,0,x,planez,z,x / 64.0,-z / 64.0);
    FQuadDrawer::Set((FQuadDrawer *)local_e8,1,x_00,planez,z_00,x_00 / 64.0,-z_00 / 64.0);
    FQuadDrawer::Set((FQuadDrawer *)local_e8,2,x_01,planez,fVar4,x_01 / 64.0,-fVar4 / 64.0);
    FQuadDrawer::Set((FQuadDrawer *)local_e8,3,fVar2,planez,(float)qd._12_4_,fVar2 / 64.0,
                     -(float)qd._12_4_ / 64.0);
    FQuadDrawer::Render((FQuadDrawer *)local_e8,6);
    FRenderState::EnableTextureMatrix(&gl_RenderState,false);
  }
  return;
}

Assistant:

void FDrawInfo::DrawFloodedPlane(wallseg * ws, float planez, sector_t * sec, bool ceiling)
{
	GLSectorPlane plane;
	int lightlevel;
	FColormap Colormap;
	FMaterial * gltexture;

	plane.GetFromSector(sec, ceiling);

	gltexture=FMaterial::ValidateTexture(plane.texture, false, true);
	if (!gltexture) return;

	if (gl_fixedcolormap) 
	{
		Colormap.Clear();
		lightlevel=255;
	}
	else
	{
		Colormap=sec->ColorMap;
		if (gltexture->tex->isFullbright())
		{
			Colormap.LightColor.r = Colormap.LightColor.g = Colormap.LightColor.b = 0xff;
			lightlevel=255;
		}
		else lightlevel=abs(ceiling? sec->GetCeilingLight() : sec->GetFloorLight());
	}

	int rel = getExtraLight();
	gl_SetColor(lightlevel, rel, Colormap, 1.0f);
	gl_SetFog(lightlevel, rel, &Colormap, false);
	gl_RenderState.SetMaterial(gltexture, CLAMP_NONE, 0, -1, false);

	float fviewx = ViewPos.X;
	float fviewy = ViewPos.Y;
	float fviewz = ViewPos.Z;

	gl_SetPlaneTextureRotation(&plane, gltexture);
	gl_RenderState.Apply();

	float prj_fac1 = (planez-fviewz)/(ws->z1-fviewz);
	float prj_fac2 = (planez-fviewz)/(ws->z2-fviewz);

	float px1 = fviewx + prj_fac1 * (ws->x1-fviewx);
	float py1 = fviewy + prj_fac1 * (ws->y1-fviewy);

	float px2 = fviewx + prj_fac2 * (ws->x1-fviewx);
	float py2 = fviewy + prj_fac2 * (ws->y1-fviewy);

	float px3 = fviewx + prj_fac2 * (ws->x2-fviewx);
	float py3 = fviewy + prj_fac2 * (ws->y2-fviewy);

	float px4 = fviewx + prj_fac1 * (ws->x2-fviewx);
	float py4 = fviewy + prj_fac1 * (ws->y2-fviewy);

	FQuadDrawer qd;
	qd.Set(0, px1, planez, py1, px1 / 64, -py1 / 64);
	qd.Set(1, px2, planez, py2, px2 / 64, -py2 / 64);
	qd.Set(2, px3, planez, py3, px3 / 64, -py3 / 64);
	qd.Set(3, px4, planez, py4, px4 / 64, -py4 / 64);
	qd.Render(GL_TRIANGLE_FAN);

	gl_RenderState.EnableTextureMatrix(false);
}